

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void __thiscall helics::apps::WebServer::stopServer(WebServer *this)

{
  size_t *psVar1;
  impl_type *piVar2;
  reactor *prVar3;
  int iVar4;
  bool bVar5;
  string_view message;
  undefined1 local_28 [8];
  epoll_data_t local_20;
  
  LOCK();
  bVar5 = (this->running)._M_base._M_i == true;
  if (bVar5) {
    (this->running)._M_base._M_i = false;
  }
  UNLOCK();
  if (bVar5) {
    message._M_str = "stopping broker web server";
    message._M_len = 0x1a;
    TypedBrokerServer::logMessage(message);
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->threadGuard);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    piVar2 = (((this->context).
               super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ioc
             ).impl_;
    bVar5 = (piVar2->mutex_).enabled_;
    if (bVar5 == true) {
      pthread_mutex_lock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
    }
    piVar2->stopped_ = true;
    if ((piVar2->mutex_).enabled_ == true) {
      psVar1 = &(piVar2->wakeup_event_).event_.state_;
      *(byte *)psVar1 = (byte)*psVar1 | 1;
      pthread_cond_broadcast((pthread_cond_t *)&(piVar2->wakeup_event_).event_);
    }
    unique0x1000024a = (select_interrupter *)CONCAT44(local_20.fd,local_28._4_4_);
    if ((piVar2->task_interrupted_ == false) &&
       (prVar3 = piVar2->task_,
       unique0x10000252 = (select_interrupter *)CONCAT44(local_20.fd,local_28._4_4_),
       prVar3 != (reactor *)0x0)) {
      piVar2->task_interrupted_ = true;
      local_28._0_4_ = 0x80000009;
      unique0x00004780 = &prVar3->interrupter_;
      epoll_ctl(prVar3->epoll_fd_,3,(prVar3->interrupter_).read_descriptor_,(epoll_event *)local_28)
      ;
    }
    if (bVar5 != false) {
      pthread_mutex_unlock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  }
  return;
}

Assistant:

void WebServer::stopServer()
{
    bool exp{true};
    if (running.compare_exchange_strong(exp, false)) {
        logMessage("stopping broker web server");
        const std::lock_guard<std::mutex> tlock(threadGuard);
        context->ioc.stop();
    }
}